

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldGenerator::GenerateInterfaceMembers
          (ImmutableEnumFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Context *pCVar2;
  pointer pcVar3;
  bool bVar4;
  MessageLite *pMVar5;
  EnumDescriptor *pEVar6;
  string_view text;
  string_view text_00;
  string_view text_01;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined2 local_d8;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  undefined2 local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined2 local_38;
  
  bVar4 = FieldDescriptor::has_presence(this->descriptor_);
  if (bVar4) {
    pFVar1 = this->descriptor_;
    pCVar2 = this->context_;
    local_80[4] = (pCVar2->options_).opensource_runtime;
    local_80[5] = (pCVar2->options_).annotate_code;
    local_80[0] = (pCVar2->options_).generate_immutable_code;
    local_80[1] = (pCVar2->options_).generate_mutable_code;
    local_80[2] = (pCVar2->options_).generate_shared_code;
    local_80[3] = (pCVar2->options_).enforce_lite;
    pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
    local_78._M_p = (pointer)&local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar3,
               pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
    pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
    local_58._M_p = (pointer)&local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar3,
               pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
    local_38._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
    local_38._1_1_ = (pCVar2->options_).jvm_dsl;
    WriteFieldAccessorDocComment(printer,pFVar1,HAZZER,(Options *)local_80,false,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_p != &local_48) {
      operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
    text._M_str = "$deprecation$boolean has$capitalized_name$();\n";
    text._M_len = 0x2e;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,&this->variables_,text);
  }
  pFVar1 = this->descriptor_;
  pMVar5 = protobuf::internal::ExtensionSet::GetMessage
                     (&(pFVar1->merged_features_->field_0)._impl_._extensions_,pb::java,
                      (MessageLite *)PTR__JavaFeatures_default_instance__01987248);
  if (*(char *)((long)&pMVar5[1]._internal_metadata_.ptr_ + 4) == '\0') {
    pEVar6 = FieldDescriptor::enum_type(pFVar1);
    if (pEVar6 != (EnumDescriptor *)0x0) {
      pEVar6 = FieldDescriptor::enum_type(pFVar1);
      bVar4 = EnumDescriptor::is_closed(pEVar6);
      if (!bVar4) {
        pFVar1 = this->descriptor_;
        pCVar2 = this->context_;
        local_d0[4] = (pCVar2->options_).opensource_runtime;
        local_d0[5] = (pCVar2->options_).annotate_code;
        local_d0[0] = (pCVar2->options_).generate_immutable_code;
        local_d0[1] = (pCVar2->options_).generate_mutable_code;
        local_d0[2] = (pCVar2->options_).generate_shared_code;
        local_d0[3] = (pCVar2->options_).enforce_lite;
        pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
        local_c8._M_p = (pointer)&local_b8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,pcVar3,
                   pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
        pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
        local_a8._M_p = (pointer)&local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar3,
                   pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
        local_88._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
        local_88._1_1_ = (pCVar2->options_).jvm_dsl;
        WriteFieldEnumValueAccessorDocComment(printer,pFVar1,GETTER,(Options *)local_d0,false,false)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_p != &local_98) {
          operator_delete(local_a8._M_p,local_98._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_p != &local_b8) {
          operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
        }
        text_00._M_str = "$deprecation$int get$capitalized_name$Value();\n";
        text_00._M_len = 0x2f;
        io::Printer::
        Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                  (printer,&this->variables_,text_00);
      }
    }
  }
  pFVar1 = this->descriptor_;
  pCVar2 = this->context_;
  local_120[4] = (pCVar2->options_).opensource_runtime;
  local_120[5] = (pCVar2->options_).annotate_code;
  local_120[0] = (pCVar2->options_).generate_immutable_code;
  local_120[1] = (pCVar2->options_).generate_mutable_code;
  local_120[2] = (pCVar2->options_).generate_shared_code;
  local_120[3] = (pCVar2->options_).enforce_lite;
  pcVar3 = (pCVar2->options_).annotation_list_file._M_dataplus._M_p;
  local_118._M_p = (pointer)&local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar3,
             pcVar3 + (pCVar2->options_).annotation_list_file._M_string_length);
  pcVar3 = (pCVar2->options_).output_list_file._M_dataplus._M_p;
  local_f8._M_p = (pointer)&local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar3,
             pcVar3 + (pCVar2->options_).output_list_file._M_string_length);
  local_d8._0_1_ = (pCVar2->options_).strip_nonfunctional_codegen;
  local_d8._1_1_ = (pCVar2->options_).jvm_dsl;
  WriteFieldAccessorDocComment(printer,pFVar1,GETTER,(Options *)local_120,false,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_p != &local_e8) {
    operator_delete(local_f8._M_p,local_e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
  }
  text_01._M_str = "$deprecation$$type$ get$capitalized_name$();\n";
  text_01._M_len = 0x2d;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,text_01);
  return;
}

Assistant:

void ImmutableEnumFieldGenerator::GenerateInterfaceMembers(
    io::Printer* printer) const {
  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                                 context_->options());
    printer->Print(variables_,
                   "$deprecation$boolean has$capitalized_name$();\n");
  }
  if (SupportUnknownEnumValue(descriptor_)) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, GETTER,
                                          context_->options());
    printer->Print(variables_,
                   "$deprecation$int get$capitalized_name$Value();\n");
  }
  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(variables_, "$deprecation$$type$ get$capitalized_name$();\n");
}